

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O3

int mbedtls_ecdhopt_initiator
              (mbedtls_ecdhopt_context *octx,mbedtls_ecdhopt_curve g,size_t *olen,uchar *buf,
              size_t blen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t base [32];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  octx->curve = g;
  if (g == MBEDTLS_ECP_DP_CURVE25519) {
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    iVar1 = (*f_rng)(p_rng,(uchar *)&octx->ctx,0x20);
    if (iVar1 == 0) {
      *olen = 0x24;
      iVar1 = -0x4f00;
      if (0x23 < blen) {
        buf[0] = '\x03';
        buf[1] = '\0';
        buf[2] = '\x1d';
        buf[3] = ' ';
        local_58[0] = '\t';
        Hacl_Curve25519_crypto_scalarmult(buf + 4,(uint8_t *)&octx->ctx,local_58);
        auVar3[0] = -(buf[0x14] == local_48[0]);
        auVar3[1] = -(buf[0x15] == local_48[1]);
        auVar3[2] = -(buf[0x16] == local_48[2]);
        auVar3[3] = -(buf[0x17] == local_48[3]);
        auVar3[4] = -(buf[0x18] == local_48[4]);
        auVar3[5] = -(buf[0x19] == local_48[5]);
        auVar3[6] = -(buf[0x1a] == local_48[6]);
        auVar3[7] = -(buf[0x1b] == local_48[7]);
        auVar3[8] = -(buf[0x1c] == local_48[8]);
        auVar3[9] = -(buf[0x1d] == local_48[9]);
        auVar3[10] = -(buf[0x1e] == local_48[10]);
        auVar3[0xb] = -(buf[0x1f] == local_48[0xb]);
        auVar3[0xc] = -(buf[0x20] == local_48[0xc]);
        auVar3[0xd] = -(buf[0x21] == local_48[0xd]);
        auVar3[0xe] = -(buf[0x22] == local_48[0xe]);
        auVar3[0xf] = -(buf[0x23] == local_48[0xf]);
        auVar2[0] = -(buf[4] == '\0');
        auVar2[1] = -(buf[5] == local_58[1]);
        auVar2[2] = -(buf[6] == local_58[2]);
        auVar2[3] = -(buf[7] == local_58[3]);
        auVar2[4] = -(buf[8] == local_58[4]);
        auVar2[5] = -(buf[9] == local_58[5]);
        auVar2[6] = -(buf[10] == local_58[6]);
        auVar2[7] = -(buf[0xb] == local_58[7]);
        auVar2[8] = -(buf[0xc] == local_58[8]);
        auVar2[9] = -(buf[0xd] == local_58[9]);
        auVar2[10] = -(buf[0xe] == local_58[10]);
        auVar2[0xb] = -(buf[0xf] == local_58[0xb]);
        auVar2[0xc] = -(buf[0x10] == local_58[0xc]);
        auVar2[0xd] = -(buf[0x11] == local_58[0xd]);
        auVar2[0xe] = -(buf[0x12] == local_58[0xe]);
        auVar2[0xf] = -(buf[0x13] == local_58[0xf]);
        auVar2 = auVar2 & auVar3;
        iVar1 = -0x4d00;
        if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) != 0xffff) {
          iVar1 = 0;
        }
      }
    }
  }
  else {
    iVar1 = mbedtls_ecp_group_load(&(octx->ctx).ec.grp,g);
    if (iVar1 == 0) {
      (octx->ctx).ec.point_format = octx->point_format;
      iVar1 = mbedtls_ecdh_make_params(&(octx->ctx).ec,olen,buf,blen,f_rng,p_rng);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdhopt_initiator( mbedtls_ecdhopt_context *octx,
                       mbedtls_ecdhopt_curve g, size_t *olen,
                       unsigned char *buf, size_t blen,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng )
{
    int ret = 0;
    octx->curve = g;

    if( g == MBEDTLS_ECP_DP_CURVE25519 )
    {
          uint8_t base[32] = {0};

          if( ( ret = f_rng( p_rng, octx->ctx.x25519.our_secret, 32 ) ) != 0 )
              return ret;

          *olen = 36;
          if( blen < *olen )
              return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

          *buf++ = MBEDTLS_ECP_TLS_NAMED_CURVE;
          *buf++ = MBEDTLS_ECP_TLS_CURVE25519 >> 8;
          *buf++ = MBEDTLS_ECP_TLS_CURVE25519 & 0xFF;
          *buf++ = 32;

          base[0] = 9; // generator of x25519
          Hacl_Curve25519_crypto_scalarmult( buf, octx->ctx.x25519.our_secret, base );

          base[0] = 0;
          if( memcmp( buf, base, 32) == 0 )
              return MBEDTLS_ERR_ECP_RANDOM_FAILED;

        return( 0 );
    }
    else
    {
          if( ( ret = mbedtls_ecp_group_load( &octx->ctx.ec.grp, g ) ) != 0 )
              return( ret );

          octx->ctx.ec.point_format = octx->point_format;
          return mbedtls_ecdh_make_params( &octx->ctx.ec, olen, buf, blen, f_rng, p_rng );
    }
}